

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void SldTrackComments(void)

{
  pointer pcVar1;
  pointer pbVar2;
  long *plVar3;
  int pageNum;
  char *pcVar4;
  pointer pbVar5;
  char *symbol;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> keyword;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar2 = sldCommentKeywords_abi_cxx11_.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((eolComment == (char *)0x0) || (FP_SourceLevelDebugging == (FILE *)0x0)) ||
     (DeviceID == (char *)0x0)) {
    __assert_fail("eolComment && IsSldExportActive()",
                  "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/sjio.cpp"
                  ,0x5cc,"void SldTrackComments()");
  }
  if ((*eolComment != '\0') &&
     (sldCommentKeywords_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      sldCommentKeywords_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pbVar5 = sldCommentKeywords_abi_cxx11_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + pbVar5->_M_string_length);
      plVar3 = local_50[0];
      symbol = eolComment;
      pcVar4 = strstr(eolComment,(char *)local_50[0]);
      if (pcVar4 != (char *)0x0) {
        if (PseudoORG == DISP_NONE) {
          pageNum = Page->Number;
        }
        else {
          pageNum = dispPageNum;
          if (dispPageNum == -1) {
            pageNum = CDevice::GetPageOfA16(Device,CurAddress);
            symbol = eolComment;
          }
        }
        WriteToSldFile(pageNum,CurAddress,'K',symbol);
        if (local_50[0] == local_40) {
          return;
        }
        operator_delete(local_50[0],local_40[0] + 1);
        return;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  return;
}

Assistant:

void SldTrackComments() {
	assert(eolComment && IsSldExportActive());
	if (!eolComment[0]) return;
	for (auto keyword : sldCommentKeywords) {
		if (strstr(eolComment, keyword.c_str())) {
			int pageNum = Page->Number;
			if (DISP_NONE != PseudoORG) {
				pageNum = LABEL_PAGE_UNDEFINED != dispPageNum ? dispPageNum : Device->GetPageOfA16(CurAddress);
			}
			WriteToSldFile(pageNum, CurAddress, 'K', eolComment);
			return;
		}
	}
}